

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# medfilt.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  undefined8 uVar4;
  ostream *poVar5;
  int write_size;
  char *pcVar6;
  ifstream *input_stream;
  bool bVar7;
  int num_input_order;
  int num_filter_order;
  allocator local_51d;
  int local_51c;
  double magic_number;
  undefined8 local_510;
  string local_508;
  vector<double,_std::allocator<double>_> output;
  ostringstream error_message_7;
  InputSourceFromStream input_source;
  MedianFilter median_filter;
  ifstream ifs;
  byte abStack_260 [488];
  option long_options [2];
  
  num_input_order = 0;
  magic_number = 0.0;
  num_filter_order = 2;
  long_options[1].flag = (int *)0x0;
  long_options[1].val = 0;
  long_options[1]._28_4_ = 0;
  long_options[1].name = (char *)0x0;
  long_options[1].has_arg = 0;
  long_options[1]._12_4_ = 0;
  long_options[0].flag = (int *)0x0;
  long_options[0].val = 1000;
  long_options[0]._28_4_ = 0;
  long_options[0].name = "magic";
  long_options[0].has_arg = 1;
  long_options[0]._12_4_ = 0;
  local_51c = 0;
  uVar4 = 0;
LAB_0010362d:
  do {
    local_510 = uVar4;
    iVar3 = ya_getopt_long_only(argc,argv,"l:m:k:w:h",long_options,(int *)0x0);
    switch(iVar3) {
    case 0x68:
      anon_unknown.dwarf_3040::PrintUsage((ostream *)&std::cout);
      return 0;
    case 0x69:
    case 0x6a:
switchD_0010365c_caseD_69:
      anon_unknown.dwarf_3040::PrintUsage((ostream *)&std::cerr);
      return 1;
    case 0x6b:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_7);
      bVar1 = sptk::ConvertStringToInteger((string *)&ifs,&num_filter_order);
      bVar7 = num_filter_order < 0;
      std::__cxx11::string::~string((string *)&ifs);
      uVar4 = local_510;
      if (!bVar1 || bVar7) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        poVar5 = std::operator<<((ostream *)&ifs,"The argument for the -k option must be a ");
        std::operator<<(poVar5,"non-negative integer");
        std::__cxx11::string::string
                  ((string *)&error_message_7,"medfilt",(allocator *)&median_filter);
        sptk::PrintErrorMessage((string *)&error_message_7,(ostringstream *)&ifs);
        goto LAB_00103aee;
      }
      goto LAB_0010362d;
    case 0x6c:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_7);
      bVar7 = sptk::ConvertStringToInteger((string *)&ifs,&num_input_order);
      bVar1 = num_input_order < 1;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar7 || bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -l option must be a positive integer")
        ;
        std::__cxx11::string::string
                  ((string *)&error_message_7,"medfilt",(allocator *)&median_filter);
        sptk::PrintErrorMessage((string *)&error_message_7,(ostringstream *)&ifs);
        goto LAB_00103aee;
      }
      num_input_order = num_input_order + -1;
      uVar4 = local_510;
      goto LAB_0010362d;
    case 0x6d:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_7);
      bVar1 = sptk::ConvertStringToInteger((string *)&ifs,&num_input_order);
      bVar7 = num_input_order < 0;
      std::__cxx11::string::~string((string *)&ifs);
      uVar4 = local_510;
      if (!bVar1 || bVar7) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        poVar5 = std::operator<<((ostream *)&ifs,"The argument for the -m option must be a ");
        std::operator<<(poVar5,"non-negative integer");
        std::__cxx11::string::string
                  ((string *)&error_message_7,"medfilt",(allocator *)&median_filter);
        sptk::PrintErrorMessage((string *)&error_message_7,(ostringstream *)&ifs);
        goto LAB_00103aee;
      }
      goto LAB_0010362d;
    }
    if (iVar3 == -1) {
      if (1 < argc - ya_optind) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"Too many input files");
        std::__cxx11::string::string
                  ((string *)&error_message_7,"medfilt",(allocator *)&median_filter);
        sptk::PrintErrorMessage((string *)&error_message_7,(ostringstream *)&ifs);
        goto LAB_00103aee;
      }
      if (argc == ya_optind) {
        pcVar6 = (char *)0x0;
      }
      else {
        pcVar6 = argv[ya_optind];
      }
      bVar1 = sptk::SetBinaryMode();
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"Cannot set translation mode");
        std::__cxx11::string::string
                  ((string *)&error_message_7,"medfilt",(allocator *)&median_filter);
        sptk::PrintErrorMessage((string *)&error_message_7,(ostringstream *)&ifs);
        goto LAB_00103aee;
      }
      input_stream = &ifs;
      std::ifstream::ifstream(input_stream);
      if ((pcVar6 != (char *)0x0) &&
         (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar6),
         (abStack_260[*(long *)(_ifs + -0x18)] & 5) != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_7);
        poVar5 = std::operator<<((ostream *)&error_message_7,"Cannot open file ");
        std::operator<<(poVar5,pcVar6);
        std::__cxx11::string::string((string *)&median_filter,"medfilt",(allocator *)&input_source);
        sptk::PrintErrorMessage((string *)&median_filter,&error_message_7);
        std::__cxx11::string::~string((string *)&median_filter);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_7);
        iVar3 = 1;
        goto LAB_00103cbc;
      }
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 == '\0') {
        input_stream = (ifstream *)&std::cin;
      }
      sptk::InputSourceFromStream::InputSourceFromStream
                (&input_source,false,num_input_order + 1,(istream *)input_stream);
      sptk::MedianFilter::MedianFilter
                (&median_filter,num_input_order,num_filter_order,
                 &input_source.super_InputSourceInterface,local_51c == 0,(bool)((byte)local_510 & 1)
                 ,magic_number);
      if (median_filter.is_valid_ == false) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_7);
        std::operator<<((ostream *)&error_message_7,"Failed to initialize MedianFilter");
        std::__cxx11::string::string((string *)&local_508,"medfilt",(allocator *)&output);
        sptk::PrintErrorMessage(&local_508,&error_message_7);
        std::__cxx11::string::~string((string *)&local_508);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_7);
        iVar3 = 1;
        goto LAB_00103caf;
      }
      iVar3 = 1;
      write_size = median_filter.num_input_order_ + 1;
      if (median_filter.apply_each_dimension_ == false) {
        write_size = iVar3;
      }
      std::vector<double,_std::allocator<double>_>::vector
                (&output,(long)write_size,(allocator_type *)&error_message_7);
      break;
    }
    if (iVar3 == 0x77) {
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_7);
      bVar1 = sptk::ConvertStringToInteger((string *)&ifs,(int *)&median_filter);
      if (bVar1) {
        bVar1 = sptk::IsInRange((int)median_filter.super_InputSourceInterface.
                                     _vptr_InputSourceInterface,0,1);
        std::__cxx11::string::~string((string *)&ifs);
        if (bVar1) {
          local_51c = (int)median_filter.super_InputSourceInterface._vptr_InputSourceInterface;
          uVar4 = local_510;
          goto LAB_0010362d;
        }
      }
      else {
        std::__cxx11::string::~string((string *)&ifs);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      poVar5 = std::operator<<((ostream *)&ifs,"The argument for the -w option must be an integer ")
      ;
      poVar5 = std::operator<<(poVar5,"in the range of ");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0);
      poVar5 = std::operator<<(poVar5," to ");
      std::ostream::operator<<((ostream *)poVar5,1);
      std::__cxx11::string::string((string *)&error_message_7,"medfilt",(allocator *)&input_source);
      sptk::PrintErrorMessage((string *)&error_message_7,(ostringstream *)&ifs);
      goto LAB_00103aee;
    }
    if (iVar3 != 1000) goto switchD_0010365c_caseD_69;
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_7);
    bVar1 = sptk::ConvertStringToDouble((string *)&ifs,&magic_number);
    uVar4 = std::__cxx11::string::~string((string *)&ifs);
    uVar4 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      std::operator<<((ostream *)&ifs,"The argument for the -magic option must be a number");
      std::__cxx11::string::string((string *)&error_message_7,"medfilt",(allocator *)&median_filter)
      ;
      sptk::PrintErrorMessage((string *)&error_message_7,(ostringstream *)&ifs);
LAB_00103aee:
      std::__cxx11::string::~string((string *)&error_message_7);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
      return 1;
    }
  } while( true );
  while (bVar1 = sptk::WriteStream<double>(0,write_size,&output,(ostream *)&std::cout,(int *)0x0),
        bVar1) {
    bVar1 = sptk::MedianFilter::Get(&median_filter,&output);
    if (!bVar1) {
      iVar3 = 0;
      goto LAB_00103ca5;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_7);
  std::operator<<((ostream *)&error_message_7,"Failed to write output");
  std::__cxx11::string::string((string *)&local_508,"medfilt",&local_51d);
  sptk::PrintErrorMessage(&local_508,&error_message_7);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_7);
LAB_00103ca5:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&output.super__Vector_base<double,_std::allocator<double>_>);
LAB_00103caf:
  sptk::MedianFilter::~MedianFilter(&median_filter);
LAB_00103cbc:
  std::ifstream::~ifstream(&ifs);
  return iVar3;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_input_order(kDefaultNumInputOrder);
  int num_filter_order(kDefaultNumFilterOrder);
  WaysToApplyFilter way_to_apply_filter(kDefaultWayToApplyFilter);
  double magic_number(0.0);
  bool is_magic_number_specified(false);

  const struct option long_options[] = {
      {"magic", required_argument, NULL, kMagic},
      {0, 0, 0, 0},
  };

  for (;;) {
    const int option_char(
        getopt_long_only(argc, argv, "l:m:k:w:h", long_options, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &num_input_order) ||
            num_input_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("medfilt", error_message);
          return 1;
        }
        --num_input_order;
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_input_order) ||
            num_input_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("medfilt", error_message);
          return 1;
        }
        break;
      }
      case 'k': {
        if (!sptk::ConvertStringToInteger(optarg, &num_filter_order) ||
            num_filter_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -k option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("medfilt", error_message);
          return 1;
        }
        break;
      }
      case 'w': {
        const int min(0);
        const int max(static_cast<int>(kNumWaysToApplyFilter) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -w option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("medfilt", error_message);
          return 1;
        }
        way_to_apply_filter = static_cast<WaysToApplyFilter>(tmp);
        break;
      }
      case kMagic: {
        if (!sptk::ConvertStringToDouble(optarg, &magic_number)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -magic option must be a number";
          sptk::PrintErrorMessage("medfilt", error_message);
          return 1;
        }
        is_magic_number_specified = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("medfilt", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("medfilt", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("medfilt", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  const int input_length(num_input_order + 1);
  sptk::InputSourceFromStream input_source(false, input_length, &input_stream);
  sptk::MedianFilter median_filter(num_input_order, num_filter_order,
                                   &input_source,
                                   kEachDimension == way_to_apply_filter,
                                   is_magic_number_specified, magic_number);
  if (!median_filter.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize MedianFilter";
    sptk::PrintErrorMessage("medfilt", error_message);
    return 1;
  }

  const int output_length(median_filter.GetSize());
  std::vector<double> output(output_length);

  while (median_filter.Get(&output)) {
    if (!sptk::WriteStream(0, output_length, output, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write output";
      sptk::PrintErrorMessage("medfilt", error_message);
      return 1;
    }
  }

  return 0;
}